

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O2

bool __thiscall cmCTestHG::LoadModifications(cmCTestHG *this)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_321;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hg_status;
  string local_308;
  string hg;
  OutputLogger err;
  StatusParser out;
  
  std::__cxx11::string::string
            ((string *)&hg,(string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool)
  ;
  std::__cxx11::string::string((string *)&out,(string *)&hg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.super_LineParser.Line._M_string_length,"status",(allocator<char> *)&err)
  ;
  __l._M_len = 2;
  __l._M_array = (iterator)&out;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&hg_status,__l,&local_321);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)out.RegexStatus.regmatch.startp + lVar1 + -0x48))
    ;
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  StatusParser::StatusParser(&out,this,"status-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"status-err> ");
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  local_308._M_string_length = 0;
  local_308.field_2._M_local_buf[0] = '\0';
  cmCTestVC::RunChild((cmCTestVC *)this,&hg_status,(OutputParser *)&out,(OutputParser *)&err,
                      &local_308,Auto);
  std::__cxx11::string::~string((string *)&local_308);
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  StatusParser::~StatusParser(&out);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&hg_status);
  std::__cxx11::string::~string((string *)&hg);
  return true;
}

Assistant:

bool cmCTestHG::LoadModifications()
{
  // Use 'hg status' to get modified files.
  std::string hg = this->CommandLineTool;
  std::vector<std::string> hg_status = { hg, "status" };
  StatusParser out(this, "status-out> ");
  OutputLogger err(this->Log, "status-err> ");
  this->RunChild(hg_status, &out, &err);
  return true;
}